

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O3

void __thiscall asmjit::v1_14::a64::ARMRAPass::onInit(ARMRAPass *this)

{
  Arch AVar1;
  BaseBuilder *pBVar2;
  FuncNode *pFVar3;
  RARegMask *pRVar4;
  BaseReg *pBVar5;
  uint uVar6;
  uint8_t uVar7;
  
  pBVar2 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  pFVar3 = (this->super_BaseRAPass)._func;
  AVar1 = (pBVar2->super_BaseEmitter)._environment._arch;
  (this->_emitHelper).super_BaseEmitHelper._emitter = &pBVar2->super_BaseEmitter;
  (this->super_BaseRAPass)._archTraits = (ArchTraits *)(_archTraits + (ulong)AVar1 * 0xd8);
  (this->super_BaseRAPass)._physRegIndex = (RARegCount)0x40402000;
  (this->super_BaseRAPass)._physRegCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x2020;
  (this->super_BaseRAPass)._physRegTotal = 0x40;
  pRVar4 = &(this->super_BaseRAPass)._availableRegs;
  (pRVar4->_masks)._data[1] = 0xffffffff;
  (pRVar4->_masks)._data[2] = 0;
  *(undefined8 *)((this->super_BaseRAPass)._availableRegs._masks._data + 3) = 0x202000000000;
  *(undefined2 *)(this->super_BaseRAPass)._scratchRegIndexes._data = 0x1c1b;
  if ((((pFVar3->_frame)._attributes & kHasPreservedFP) == kNoAttributes) &&
     ((pBVar2->super_BaseEmitter)._environment._platformABI != kDarwin)) {
    uVar6 = 0x7ffbffff;
    uVar7 = '\x1e';
  }
  else {
    uVar6 = 0x5ffbffff;
    uVar7 = '\x1d';
  }
  (this->super_BaseRAPass)._availableRegs._masks._data[0] = uVar6;
  (this->super_BaseRAPass)._availableRegCount.field_0._regs[0] = uVar7;
  (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature = 0x8000039;
  (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._baseId = 0x1f;
  pBVar5 = &(this->super_BaseRAPass)._sp;
  (pBVar5->super_Operand).super_Operand_._data[0] = 0;
  (pBVar5->super_Operand).super_Operand_._data[1] = 0;
  (this->super_BaseRAPass)._fp.super_Operand.super_Operand_._signature = 0x8000039;
  (this->super_BaseRAPass)._fp.super_Operand.super_Operand_._baseId = 0x1d;
  pBVar5 = &(this->super_BaseRAPass)._fp;
  (pBVar5->super_Operand).super_Operand_._data[0] = 0;
  (pBVar5->super_Operand).super_Operand_._data[1] = 0;
  return;
}

Assistant:

void ARMRAPass::onInit() noexcept {
  Arch arch = cc()->arch();

  _emitHelper._emitter = _cb;

  _archTraits = &ArchTraits::byArch(arch);
  _physRegCount.set(RegGroup::kGp, 32);
  _physRegCount.set(RegGroup::kVec, 32);
  _physRegCount.set(RegGroup::kMask, 0);
  _physRegCount.set(RegGroup::kExtraVirt3, 0);
  _buildPhysIndex();

  _availableRegCount = _physRegCount;
  _availableRegs[RegGroup::kGp] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kGp));
  _availableRegs[RegGroup::kVec] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kVec));
  _availableRegs[RegGroup::kMask] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kMask));
  _availableRegs[RegGroup::kExtraVirt3] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kExtraVirt3));

  _scratchRegIndexes[0] = uint8_t(27);
  _scratchRegIndexes[1] = uint8_t(28);

  // The architecture specific setup makes implicitly all registers available. So
  // make unavailable all registers that are special and cannot be used in general.
  bool hasFP = _func->frame().hasPreservedFP();

  // Apple ABI requires that the frame-pointer register is not changed by leaf functions and properly updated
  // by non-leaf functions. So, let's make this register unavailable as it's just not safe to update it.
  if (hasFP || cc()->environment().isDarwin())
    makeUnavailable(RegGroup::kGp, Gp::kIdFp);

  makeUnavailable(RegGroup::kGp, Gp::kIdSp);
  makeUnavailable(RegGroup::kGp, Gp::kIdOs); // OS-specific use, usually TLS.

  _sp = sp;
  _fp = x29;
}